

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::anon_unknown_13::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  int iVar1;
  IoExc *pIVar2;
  ArgExc *pAVar3;
  undefined8 in_RCX;
  undefined4 in_EDX;
  TileProcess *in_RSI;
  byte *in_RDI;
  undefined8 in_R8;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *unaff_retaddr;
  bool isfirst;
  exr_attr_box2i_t dw;
  int tileY;
  int tileX;
  int absY;
  int absX;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined3 in_stack_ffffffffffffffb4;
  uint fb_absX;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  TileProcess *in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe8;
  
  fb_absX = CONCAT13(*in_RDI,in_stack_ffffffffffffffb4) & 0x1ffffff;
  if ((*in_RDI & 1) == 0) {
    iVar1 = exr_decoding_update(in_RSI,in_EDX,in_RDI + 8,in_RDI + 0x48);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to update decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  else {
    iVar1 = exr_decoding_initialize(in_RSI,in_EDX,in_RDI + 8,in_RDI + 0x48);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to initialize decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    *in_RDI = 0;
  }
  iVar1 = exr_get_data_window(in_RSI,in_EDX,&stack0xffffffffffffffb8);
  if (iVar1 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query the data window.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar1 = exr_get_tile_sizes(in_RSI,in_EDX,in_RDI[0x1c],in_RDI[0x1d],&local_34,&local_38);
  if (iVar1 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query the data window.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_2c = in_stack_ffffffffffffffb8 + local_34 * *(int *)(in_RDI + 0xc);
  local_30 = in_stack_ffffffffffffffbc + local_38 * *(int *)(in_RDI + 0x10);
  update_pointers(in_stack_ffffffffffffffc0,
                  (FrameBuffer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                  fb_absX,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                  in_stack_ffffffffffffffa8);
  if (((fb_absX & 0x1000000) != 0) &&
     (iVar1 = exr_decoding_choose_default_routines(in_RSI,in_EDX,in_RDI + 0x48), iVar1 != 0)) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Unable to choose decoder routines");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  iVar1 = exr_decoding_run(in_RSI,in_EDX,in_RDI + 0x48);
  if (iVar1 == 0) {
    run_fill(in_RSI,(FrameBuffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RCX >> 0x20),(int)in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
             unaff_retaddr);
    return;
  }
  pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(pIVar2,"Unable to run decoder");
  __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    const std::vector<Slice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;

    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    if (EXR_ERR_SUCCESS != exr_decoding_run (ctxt, pn, &decoder))
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}